

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::write_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t blob_size,
          PayloadWriteFlags flags)

{
  long *plVar1;
  ulong uVar2;
  DatabaseInterface *pDVar3;
  pointer pcVar4;
  int iVar5;
  size_type sVar6;
  undefined8 *puVar7;
  long *plVar8;
  DatabaseInterface *pDVar9;
  undefined1 uVar10;
  char cVar11;
  ulong uVar12;
  uint __val;
  string write_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Hash local_d0;
  PayloadWriteFlags local_c4;
  long *local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  uint local_98;
  undefined4 uStack_94;
  ulong local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  void *local_60;
  size_t local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  uVar10 = 0;
  if ((this->mode < ExclusiveOverWrite) && (this->mode != ReadOnly)) {
    local_d0 = hash;
    sVar6 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this->primed_hashes[tag]._M_h,&local_d0);
    uVar10 = 1;
    if (sVar6 == 0) {
      pDVar3 = (this->readonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar3 != (DatabaseInterface *)0x0) &&
         (iVar5 = (*pDVar3->_vptr_DatabaseInterface[5])(pDVar3,tag,local_d0), (char)iVar5 != '\0'))
      {
        return true;
      }
      pDVar3 = (this->writeonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar3 != (DatabaseInterface *)0x0) &&
         (iVar5 = (*pDVar3->_vptr_DatabaseInterface[5])(pDVar3,tag,local_d0), (char)iVar5 != '\0'))
      {
        return true;
      }
      if (this->need_writeonly_database == true) {
        local_c4 = flags;
        local_60 = blob;
        local_58 = blob_size;
        if ((this->writeonly_interface)._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl ==
            (DatabaseInterface *)0x0) {
          __val = 1;
          do {
            pcVar4 = (this->base_path)._M_dataplus._M_p;
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar4,pcVar4 + (this->base_path)._M_string_length);
            std::__cxx11::string::append((char *)&local_50);
            cVar11 = '\x03' - (__val < 100);
            if (__val < 10) {
              cVar11 = '\x01';
            }
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar11);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,local_98,__val);
            uVar12 = 0xf;
            if (local_50 != local_40) {
              uVar12 = local_40[0];
            }
            uVar2 = CONCAT44(uStack_94,local_98) + local_48;
            if (uVar12 < uVar2) {
              uVar12 = 0xf;
              if (local_a0 != local_90) {
                uVar12 = local_90[0];
              }
              if (uVar12 < uVar2) goto LAB_00113d70;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_50)
              ;
            }
            else {
LAB_00113d70:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_a0);
            }
            local_c0 = &local_b0;
            plVar1 = puVar7 + 2;
            if ((long *)*puVar7 == plVar1) {
              local_b0 = *plVar1;
              uStack_a8 = puVar7[3];
            }
            else {
              local_b0 = *plVar1;
              local_c0 = (long *)*puVar7;
            }
            local_b8 = puVar7[1];
            *puVar7 = plVar1;
            puVar7[1] = 0;
            *(undefined1 *)plVar1 = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_80 = &local_70;
            plVar1 = plVar8 + 2;
            if ((long *)*plVar8 == plVar1) {
              local_70 = *plVar1;
              lStack_68 = plVar8[3];
            }
            else {
              local_70 = *plVar1;
              local_80 = (long *)*plVar8;
            }
            local_78 = plVar8[1];
            *plVar8 = (long)plVar1;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0,local_90[0] + 1);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            pDVar9 = create_stream_archive_database((char *)local_80,ExclusiveOverWrite);
            pDVar3 = (this->writeonly_interface)._M_t.
                     super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
            (this->writeonly_interface)._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar9;
            if (pDVar3 != (DatabaseInterface *)0x0) {
              (*pDVar3->_vptr_DatabaseInterface[1])();
            }
            iVar5 = (*((this->writeonly_interface)._M_t.
                       super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                       .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl)->
                      _vptr_DatabaseInterface[2])();
            if ((char)iVar5 == '\0') {
              pDVar3 = (this->writeonly_interface)._M_t.
                       super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                       .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
              (this->writeonly_interface)._M_t.
              super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ._M_t.
              super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
              .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                   (DatabaseInterface *)0x0;
              if (pDVar3 != (DatabaseInterface *)0x0) {
                (*pDVar3->_vptr_DatabaseInterface[1])();
              }
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,local_70 + 1);
            }
          } while ((__val < 0xff) &&
                  (__val = __val + 1,
                  (this->writeonly_interface)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl ==
                  (DatabaseInterface *)0x0));
        }
        this->need_writeonly_database = false;
        blob = local_60;
        blob_size = local_58;
        flags = local_c4;
      }
      pDVar3 = (this->writeonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar3 == (DatabaseInterface *)0x0) {
        uVar10 = 0;
      }
      else {
        iVar5 = (*pDVar3->_vptr_DatabaseInterface[4])
                          (pDVar3,tag,local_d0,blob,blob_size,(ulong)flags);
        uVar10 = (undefined1)iVar5;
      }
    }
  }
  return (bool)uVar10;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t blob_size, PayloadWriteFlags flags) override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		if (writeonly_interface && writeonly_interface->has_entry(tag, hash))
			return true;

		if (need_writeonly_database)
		{
			// Lazily create a new database. Open the database file exclusively to work concurrently with other processes.
			// Don't try forever.
			for (unsigned index = 1; index < 256 && !writeonly_interface; index++)
			{
				std::string write_path = base_path + "." + std::to_string(index) + ".foz";
				writeonly_interface.reset(create_stream_archive_database(write_path.c_str(), DatabaseMode::ExclusiveOverWrite));
				if (!writeonly_interface->prepare())
					writeonly_interface.reset();
			}

			need_writeonly_database = false;
		}

		if (writeonly_interface)
			return writeonly_interface->write_entry(tag, hash, blob, blob_size, flags);
		else
			return false;
	}